

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O3

int __thiscall CMKDCommand::doWhat(CMKDCommand *this,CClient *pClient)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EFTPSTATE EVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  string ret_1;
  string ret;
  string local_1088;
  long *local_1068;
  long local_1060;
  long local_1058;
  long lStack_1050;
  undefined1 *local_1048 [2];
  undefined1 local_1038 [16];
  string local_1028 [128];
  
  EVar2 = CClient::GetClientState(pClient);
  if ((int)EVar2 < 3) {
    local_1028[0]._M_dataplus._M_p = (pointer)&local_1028[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1028,"530 Please login with USER and PASS.\r\n","");
    CClient::sendMsg(pClient,local_1028);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1028[0]._M_dataplus._M_p == &local_1028[0].field_2) {
      return -1;
    }
  }
  else {
    CClient::GetUserDir_abi_cxx11_(local_1028,pClient);
    chdir(local_1028[0]._M_dataplus._M_p);
    paVar1 = &local_1028[0].field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1028[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1028[0]._M_dataplus._M_p);
    }
    iVar3 = mkdir((this->super_CCommand).m_Args._M_dataplus._M_p,0x1fd);
    if (iVar3 == 0) {
      chdir((this->super_CCommand).m_Args._M_dataplus._M_p);
      bzero(local_1028,0x1000);
      getcwd((char *)local_1028,0x1000);
      local_1048[0] = local_1038;
      sVar4 = strlen((char *)local_1028);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1048,local_1028,(long)&local_1028[0]._M_dataplus._M_p + sVar4);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1048,0,(char *)0x0,0x11f5d1);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_1058 = *plVar6;
        lStack_1050 = plVar5[3];
        local_1068 = &local_1058;
      }
      else {
        local_1058 = *plVar6;
        local_1068 = (long *)*plVar5;
      }
      local_1060 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1068);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1088.field_2._M_allocated_capacity = *psVar7;
        local_1088.field_2._8_8_ = plVar5[3];
        local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
      }
      else {
        local_1088.field_2._M_allocated_capacity = *psVar7;
        local_1088._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1088._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_1068 != &local_1058) {
        operator_delete(local_1068);
      }
      if (local_1048[0] != local_1038) {
        operator_delete(local_1048[0]);
      }
      CClient::sendMsg(pClient,&local_1088);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
        operator_delete(local_1088._M_dataplus._M_p);
      }
      return 1;
    }
    local_1028[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1028,"550 Create directory operation failed.\r\n","");
    CClient::sendMsg(pClient,local_1028);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1028[0]._M_dataplus._M_p == paVar1) {
      return -1;
    }
  }
  operator_delete(local_1028[0]._M_dataplus._M_p);
  return -1;
}

Assistant:

int CMKDCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        chdir(pClient->GetUserDir().c_str());
        if(0 == mkdir(m_Args.c_str(), S_IRWXU | S_IRWXG | S_IROTH | S_IXOTH)){
            chdir(m_Args.c_str());
            char buffer[BUFFER_SIZE];
            bzero(buffer,BUFFER_SIZE);
            getcwd(buffer,BUFFER_SIZE);
            string ret = "257 \"" + string(buffer) + "\" created.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else {
            string ret = "550 Create directory operation failed.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}